

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

string * __thiscall
slang::CommandLine::Option::set
          (string *__return_storage_ptr__,Option *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *target,string_view param_2,string_view value)

{
  size_t *psVar1;
  long lVar2;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> sVar3;
  string_view value_00;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_68;
  
  local_68.data_ = (pointer)local_68.firstElement;
  local_68.len = 0;
  local_68.cap = 2;
  value_00._M_str._0_4_ = ((this->flags).m_bits & 2) >> 1;
  value_00._M_len = (size_t)value._M_str;
  value_00._M_str._4_4_ = 0;
  sVar3 = parseList((slang *)value._M_len,value_00,SUB81(&local_68,0),
                    (SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_2UL> *)
                    param_2._M_str);
  for (lVar2 = 0; sVar3._M_extent._M_extent_value._M_extent_value << 4 != lVar2;
      lVar2 = lVar2 + 0x10) {
    psVar1 = (size_t *)((long)&(sVar3._M_ptr)->_M_len + lVar2);
    local_78._M_len = *psVar1;
    local_78._M_str = (char *)psVar1[1];
    value._M_str = (char *)&local_78;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)target,&local_78
              );
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::cleanup
            (&local_68,(EVP_PKEY_CTX *)value._M_str);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::vector<std::string>& target, std::string_view,
                                     std::string_view value) {
    SmallVector<std::string_view> splitMem;
    for (auto entry : parseList(value, flags.has(CommandLineFlags::CommaList), splitMem))
        target.emplace_back(entry);
    return {};
}